

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,BinopExpression *binop_statement)

{
  ostream *poVar1;
  BinaryOperatorType type;
  string local_48;
  
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->stream_,"BinopExpression: ",0x11);
  ToString_abi_cxx11_(&local_48,(IRT *)(ulong)(uint)(int)(char)binop_statement->operator_type_,type)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->stream_,local_48._M_dataplus._M_p,local_48._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(binop_statement->first_->super_BaseElement)._vptr_BaseElement[2])(binop_statement->first_,this)
  ;
  (*(binop_statement->second_->super_BaseElement)._vptr_BaseElement[2])
            (binop_statement->second_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(BinopExpression *binop_statement) {
  PrintTabs();
  stream_ << "BinopExpression: " << ToString(binop_statement->operator_type_) << std::endl;
  ++num_tabs_;
  binop_statement->first_->Accept(this);
  binop_statement->second_->Accept(this);
  --num_tabs_;
}